

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O1

bool __thiscall TRM::TGAImage::scale(TGAImage *this,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  int iVar9;
  uchar *__dest;
  int iVar10;
  int iVar11;
  size_t __n;
  int iVar12;
  int local_b0;
  int local_a8;
  
  puVar4 = this->data;
  if (puVar4 != (uchar *)0x0 && (0 < h && 0 < w)) {
    iVar1 = this->bytespp;
    __n = (size_t)iVar1;
    puVar7 = (uchar *)operator_new__((long)(h * w * iVar1));
    iVar2 = this->height;
    if (0 < iVar2) {
      iVar5 = iVar1 * w;
      iVar3 = this->width;
      local_a8 = 0;
      iVar9 = 0;
      iVar11 = 0;
      local_b0 = 0;
      do {
        if (0 < iVar3) {
          iVar6 = 0;
          lVar8 = (long)-iVar1;
          iVar12 = -iVar1;
          iVar10 = iVar3 - w;
          do {
            lVar8 = lVar8 + __n;
            iVar10 = iVar10 + w;
            if (iVar3 <= iVar10) {
              __dest = puVar7 + (long)iVar12 + (long)iVar9 + __n;
              do {
                iVar10 = iVar10 - iVar3;
                memcpy(__dest,puVar4 + lVar8 + local_b0,__n);
                iVar12 = iVar12 + iVar1;
                __dest = __dest + __n;
              } while (iVar3 <= iVar10);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != iVar3);
        }
        for (iVar11 = iVar11 + h; iVar2 <= iVar11; iVar11 = iVar11 - iVar2) {
          if (iVar2 * 2 <= iVar11) {
            memcpy(puVar7 + iVar9 + iVar5,puVar7 + iVar9,(long)iVar5);
          }
          iVar9 = iVar9 + iVar5;
        }
        local_b0 = local_b0 + iVar3 * iVar1;
        local_a8 = local_a8 + 1;
      } while (local_a8 != iVar2);
    }
    operator_delete__(puVar4);
    this->data = puVar7;
    this->width = w;
    this->height = h;
  }
  return puVar4 != (uchar *)0x0 && (0 < h && 0 < w);
}

Assistant:

bool TGAImage::scale(int w, int h) {
  if (w <= 0 || h <= 0 || !data) return false;
  unsigned char *tdata = new unsigned char[w * h * bytespp];
  int nscanline = 0;
  int oscanline = 0;
  int erry = 0;
  unsigned long nlinebytes = w * bytespp;
  unsigned long olinebytes = width * bytespp;
  for (int j = 0; j < height; j++) {
    int errx = width - w;
    int nx = -bytespp;
    int ox = -bytespp;
    for (int i = 0; i < width; i++) {
      ox += bytespp;
      errx += w;
      while (errx >= (int)width) {
        errx -= width;
        nx += bytespp;
        memcpy(tdata + nscanline + nx, data + oscanline + ox, bytespp);
      }
    }
    erry += h;
    oscanline += olinebytes;
    while (erry >= (int)height) {
      if (erry >= (int)height << 1)  // it means we jump over a scanline
        memcpy(tdata + nscanline + nlinebytes, tdata + nscanline, nlinebytes);
      erry -= height;
      nscanline += nlinebytes;
    }
  }
  delete[] data;
  data = tdata;
  width = w;
  height = h;
  return true;
}